

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O3

int forcingStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  sunrealtype tret;
  undefined8 local_30;
  
  puVar1 = (undefined8 *)ark_mem->step_mem;
  if (puVar1 == (undefined8 *)0x0) {
    iVar4 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"forcingStep_TakeStep",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    uVar2 = *puVar1;
    dVar6 = ark_mem->h + ark_mem->tn;
    local_30 = 0;
    iVar3 = SUNStepper_Reset(uVar2,ark_mem->yn);
    iVar4 = -0x33;
    if (((iVar3 == 0) && (iVar3 = SUNStepper_SetStopTime(dVar6,uVar2), iVar3 == 0)) &&
       (iVar3 = SUNStepper_Evolve(dVar6,uVar2,ark_mem->ycur,&local_30), iVar3 == 0)) {
      puVar1[2] = puVar1[2] + 1;
      uVar2 = puVar1[1];
      iVar3 = SUNStepper_SetStopTime(dVar6,uVar2);
      if (iVar3 == 0) {
        dVar5 = 1.0 / ark_mem->h;
        N_VLinearSum(dVar5,-dVar5,ark_mem->ycur,ark_mem->yn,ark_mem->tempv1);
        iVar3 = SUNStepper_SetForcing(0,0,uVar2,&ark_mem->tempv1,1);
        if ((iVar3 == 0) &&
           (iVar3 = SUNStepper_Evolve(dVar6,uVar2,ark_mem->ycur,&local_30), iVar3 == 0)) {
          puVar1[3] = puVar1[3] + 1;
          iVar3 = SUNStepper_SetForcing(0,0,uVar2,0,0);
          iVar4 = -0x33;
          if (iVar3 == 0) {
            iVar4 = 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int forcingStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                int* nflagPtr)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  *nflagPtr = ARK_SUCCESS; /* No algebraic solver */
  *dsmPtr   = ZERO;        /* No error estimate */

  SUNStepper s0    = step_mem->stepper[0];
  sunrealtype tout = ark_mem->tn + ark_mem->h;
  sunrealtype tret = ZERO;

  /* Evolve stepper 0 on its own */
  SUNLogInfo(ARK_LOGGER, "begin-partition", "partition = 0");

  SUNErrCode err = SUNStepper_Reset(s0, ark_mem->tn, ark_mem->yn);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed stepper reset, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetStopTime(s0, tout);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set stop time, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_Evolve(s0, tout, ark_mem->ycur, &tret);
  SUNLogExtraDebugVec(ARK_LOGGER, "partition state", ark_mem->ycur, "y_par(:) =");
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition", "status = failed evolve, err = %i",
               err);
    return ARK_SUNSTEPPER_ERR;
  }
  step_mem->n_stepper_evolves[0]++;

  SUNLogInfo(ARK_LOGGER, "end-partition", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-partition", "partition = 1");

  SUNStepper s1 = step_mem->stepper[1];
  /* A reset is not needed because steeper 1's state is consistent with the
   * forcing method */
  err = SUNStepper_SetStopTime(s1, tout);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set stop time, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  /* Write tendency (ycur - yn)/h into stepper 1 forcing */
  sunrealtype hinv = SUN_RCONST(1.0) / ark_mem->h;
  N_VLinearSum(hinv, ark_mem->ycur, -hinv, ark_mem->yn, ark_mem->tempv1);
  err = SUNStepper_SetForcing(s1, ZERO, ZERO, &ark_mem->tempv1, 1);
  SUNLogExtraDebugVec(ARK_LOGGER, "forcing", ark_mem->tempv1, "forcing(:) =");
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set forcing, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  /* Evolve stepper 1 with the forcing */
  err = SUNStepper_Evolve(s1, tout, ark_mem->ycur, &tret);
  SUNLogExtraDebugVec(ARK_LOGGER, "partition state", ark_mem->ycur, "y_par(:) =");
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition", "status = failed evolve, err = %i",
               err);
    return ARK_SUNSTEPPER_ERR;
  }
  step_mem->n_stepper_evolves[1]++;

  /* Clear the forcing so it doesn't get included in a fullRhs call */
  err = SUNStepper_SetForcing(s1, ZERO, ZERO, NULL, 0);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set forcing, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  SUNLogInfo(ARK_LOGGER, "end-partition", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");

  return ARK_SUCCESS;
}